

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int parse_servercmd(httprequest *req)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  int extraout_EAX_01;
  char *pcVar5;
  FILE *__stream;
  uint *puVar6;
  char *pcVar7;
  int num;
  char *orgcmd;
  size_t cmdsize;
  uint local_44;
  char *local_40;
  size_t local_38;
  
  pcVar5 = test2file(req->testno);
  __stream = fopen64(pcVar5,"rb");
  if (__stream == (FILE *)0x0) {
    puVar6 = (uint *)__errno_location();
    uVar3 = *puVar6;
    pcVar7 = strerror(uVar3);
    logmsg("fopen() failed with error: %d %s",(ulong)uVar3,pcVar7);
    logmsg("  [1] Error opening file: %s",pcVar5);
    logmsg("  Couldn\'t open test file %ld",req->testno);
    iVar4 = extraout_EAX_00;
  }
  else {
    local_40 = (char *)0x0;
    local_38 = 0;
    local_44 = 0;
    uVar3 = getpart(&local_40,&local_38,"reply","servercmd",(FILE *)__stream);
    fclose(__stream);
    if (uVar3 == 0) {
      req->connmon = false;
      pcVar5 = local_40;
      do {
        if ((pcVar5 == (char *)0x0) || (local_38 == 0)) break;
        iVar4 = strncmp("auth_required",pcVar5,0xd);
        if (iVar4 == 0) {
          logmsg("instructed to require authorization header");
          req->auth_req = true;
        }
        else {
          iVar4 = strncmp("idle",pcVar5,4);
          if (iVar4 == 0) {
            logmsg("instructed to idle");
            req->rcmd = 1;
            req->open = true;
          }
          else {
            iVar4 = strncmp("stream",pcVar5,6);
            if (iVar4 == 0) {
              logmsg("instructed to stream");
              req->rcmd = 2;
            }
            else {
              iVar4 = strncmp("connection-monitor",pcVar5,0x12);
              if (iVar4 == 0) {
                logmsg("enabled connection monitoring");
                req->connmon = true;
              }
              else {
                iVar4 = strncmp("upgrade",pcVar5,7);
                if (iVar4 == 0) {
                  logmsg("enabled upgrade to http2");
                  req->upgrade = true;
                }
                else {
                  iVar4 = __isoc99_sscanf(pcVar5,"pipe: %d",&local_44);
                  if (iVar4 == 1) {
                    logmsg("instructed to allow a pipe size of %d",(ulong)local_44);
                    if ((int)local_44 < 0) {
                      logmsg("negative pipe size ignored");
                    }
                    else if (local_44 != 0) {
                      req->pipe = local_44 - 1;
                    }
                  }
                  else {
                    iVar4 = __isoc99_sscanf(pcVar5,"skip: %d",&local_44);
                    if (iVar4 == 1) {
                      logmsg("instructed to skip this number of bytes %d",(ulong)local_44);
                      req->skip = local_44;
                    }
                    else {
                      iVar4 = __isoc99_sscanf(pcVar5,"writedelay: %d",&local_44);
                      if (iVar4 == 1) {
                        logmsg("instructed to delay %d secs between packets",(ulong)local_44);
                        req->writedelay = local_44;
                      }
                      else {
                        logmsg("Unknown <servercmd> instruction found: %s",pcVar5);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar7 = strchr(pcVar5,0xd);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = strchr(pcVar5,10);
        }
        if (pcVar7 == (char *)0x0) {
LAB_001089b8:
          bVar2 = false;
          pcVar7 = pcVar5;
        }
        else {
          for (; (cVar1 = *pcVar7, cVar1 == '\n' || (cVar1 == '\r')); pcVar7 = pcVar7 + 1) {
          }
          if (cVar1 == '\0') goto LAB_001089b8;
          bVar2 = true;
        }
        pcVar5 = pcVar7;
      } while (bVar2);
      free(local_40);
      return extraout_EAX_01;
    }
    logmsg("getpart() failed with error: %d",(ulong)uVar3);
    iVar4 = extraout_EAX;
  }
  req->open = false;
  return iVar4;
}

Assistant:

static int parse_servercmd(struct httprequest *req)
{
  FILE *stream;
  char *filename;
  int error;

  filename = test2file(req->testno);

  stream=fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [1] Error opening file: %s", filename);
    logmsg("  Couldn't open test file %ld", req->testno);
    req->open = FALSE; /* closes connection */
    return 1; /* done */
  }
  else {
    char *orgcmd = NULL;
    char *cmd = NULL;
    size_t cmdsize = 0;
    int num=0;

    /* get the custom server control "commands" */
    error = getpart(&orgcmd, &cmdsize, "reply", "servercmd", stream);
    fclose(stream);
    if(error) {
      logmsg("getpart() failed with error: %d", error);
      req->open = FALSE; /* closes connection */
      return 1; /* done */
    }

    req->connmon = FALSE;

    cmd = orgcmd;
    while(cmd && cmdsize) {
      char *check;

      if(!strncmp(CMD_AUTH_REQUIRED, cmd, strlen(CMD_AUTH_REQUIRED))) {
        logmsg("instructed to require authorization header");
        req->auth_req = TRUE;
      }
      else if(!strncmp(CMD_IDLE, cmd, strlen(CMD_IDLE))) {
        logmsg("instructed to idle");
        req->rcmd = RCMD_IDLE;
        req->open = TRUE;
      }
      else if(!strncmp(CMD_STREAM, cmd, strlen(CMD_STREAM))) {
        logmsg("instructed to stream");
        req->rcmd = RCMD_STREAM;
      }
      else if(!strncmp(CMD_CONNECTIONMONITOR, cmd,
                       strlen(CMD_CONNECTIONMONITOR))) {
        logmsg("enabled connection monitoring");
        req->connmon = TRUE;
      }
      else if(!strncmp(CMD_UPGRADE, cmd, strlen(CMD_UPGRADE))) {
        logmsg("enabled upgrade to http2");
        req->upgrade = TRUE;
      }
      else if(1 == sscanf(cmd, "pipe: %d", &num)) {
        logmsg("instructed to allow a pipe size of %d", num);
        if(num < 0)
          logmsg("negative pipe size ignored");
        else if(num > 0)
          req->pipe = num-1; /* decrease by one since we don't count the
                                first request in this number */
      }
      else if(1 == sscanf(cmd, "skip: %d", &num)) {
        logmsg("instructed to skip this number of bytes %d", num);
        req->skip = num;
      }
      else if(1 == sscanf(cmd, "writedelay: %d", &num)) {
        logmsg("instructed to delay %d secs between packets", num);
        req->writedelay = num;
      }
      else {
        logmsg("Unknown <servercmd> instruction found: %s", cmd);
      }
      /* try to deal with CRLF or just LF */
      check = strchr(cmd, '\r');
      if(!check)
        check = strchr(cmd, '\n');

      if(check) {
        /* get to the letter following the newline */
        while((*check == '\r') || (*check == '\n'))
          check++;

        if(!*check)
          /* if we reached a zero, get out */
          break;
        cmd = check;
      }
      else
        break;
    }
    free(orgcmd);
  }

  return 0; /* OK! */
}